

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_offset_datetime<toml::type_config>
          (location *loc,context<toml::type_config> *ctx)

{
  local_date d;
  offset_datetime_format_info fmt_00;
  offset_datetime_type x;
  local_time t;
  bool bVar1;
  char_type_conflict cVar2;
  __tuple_element_t<1UL,_tuple<local_time,_local_time_format_info,_region>_> *p_Var3;
  const_reference pvVar4;
  __tuple_element_t<0UL,_tuple<local_date,_local_date_format_info,_region>_> *p_Var5;
  __tuple_element_t<0UL,_tuple<local_time,_local_time_format_info,_region>_> *p_Var6;
  context<toml::type_config> *in_RDX;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_RDI;
  offset_datetime val;
  region reg;
  value_type minute;
  value_type hour;
  source_location src_2;
  source_location src_1;
  result<int,_toml::detail::none_t> minute_r;
  result<int,_toml::detail::none_t> hour_r;
  time_offset offset;
  string ofs_str;
  context<toml::type_config> *in_stack_00000bd0;
  location *in_stack_00000bd8;
  region ofs_reg;
  result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
  time_fmt_reg;
  source_location src;
  result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
  date_fmt_reg;
  offset_datetime_format_info fmt;
  spec *spec;
  location first;
  source_location *in_stack_ffffffffffffee18;
  success_type *s;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_stack_ffffffffffffee20;
  size_type in_stack_ffffffffffffee28;
  location *in_stack_ffffffffffffee30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this;
  location *in_stack_ffffffffffffee38;
  location *in_stack_ffffffffffffee40;
  location *in_stack_ffffffffffffee48;
  region *in_stack_ffffffffffffee50;
  allocator<char> *__a;
  either *in_stack_ffffffffffffee58;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffee68;
  basic_value<toml::type_config> *in_stack_ffffffffffffee70;
  result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
  *in_stack_ffffffffffffee78;
  source_location in_stack_ffffffffffffee80;
  location *in_stack_ffffffffffffee88;
  region *in_stack_ffffffffffffee90;
  region *in_stack_ffffffffffffee98;
  source_location *in_stack_ffffffffffffeea0;
  basic_value<toml::type_config> *in_stack_ffffffffffffef08;
  undefined8 in_stack_ffffffffffffef48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1078;
  size_t local_1068;
  size_t local_1058;
  size_t sStack_1050;
  size_t local_1048;
  size_t sStack_1040;
  string *in_stack_ffffffffffffefd8;
  source_location *in_stack_ffffffffffffefe0;
  string *in_stack_ffffffffffffefe8;
  string *in_stack_fffffffffffff070;
  location *in_stack_fffffffffffff078;
  either *in_stack_fffffffffffff080;
  string *in_stack_fffffffffffff088;
  local_datetime local_e5e;
  offset_datetime local_e50 [7];
  allocator<char> local_dd1 [264];
  allocator<char> local_cc9 [213];
  time_offset local_bf4;
  time_offset local_bf2;
  undefined **local_bf0;
  int local_be4;
  undefined **local_be0;
  value_type local_bd8;
  __impl local_bd1 [6];
  location local_b31;
  result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
  local_ab8 [2];
  region local_979;
  source_location local_8d9;
  region local_860 [3];
  result<int,_toml::detail::none_t> local_708 [5];
  result<int,_toml::detail::none_t> local_6dc;
  time_offset local_6d2 [20];
  allocator<char> local_6a9 [144];
  allocator<char> local_619 [345];
  undefined **local_4c0;
  undefined **local_4b8;
  undefined **local_4b0;
  result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
  local_450;
  allocator<char> local_3b9 [121];
  context<toml::type_config> *in_stack_fffffffffffffcc0;
  location *in_stack_fffffffffffffcc8;
  allocator<char> local_319 [437];
  int local_164;
  undefined **local_160;
  result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
  local_f0;
  offset_datetime_format_info local_78;
  spec *local_68;
  context<toml::type_config> *local_18;
  
  local_18 = in_RDX;
  location::location(in_stack_ffffffffffffee40,in_stack_ffffffffffffee38);
  local_68 = context<toml::type_config>::toml_spec(local_18);
  offset_datetime_format_info::offset_datetime_format_info(&local_78);
  parse_local_date_only<toml::type_config>(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  bVar1 = result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
          ::is_err(&local_f0);
  if (bVar1) {
    local_160 = &PTR_s__workspace_llm4binary_github_lic_009330a0;
    result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
    ::unwrap_err((result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
                  *)in_stack_ffffffffffffee78,in_stack_ffffffffffffee80);
    err<toml::error_info&>((error_info *)in_stack_ffffffffffffee78);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (in_stack_ffffffffffffee20,(failure_type *)in_stack_ffffffffffffee18);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x667917);
    local_164 = 1;
    goto LAB_00668ef6;
  }
  cVar2 = location::current((location *)in_stack_ffffffffffffee18);
  if (cVar2 == 'T') {
    location::advance(in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
    local_78.delimiter = upper_T;
  }
  else {
    cVar2 = location::current((location *)in_stack_ffffffffffffee18);
    if (cVar2 == 't') {
      location::advance(in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
      local_78.delimiter = lower_t;
    }
    else {
      cVar2 = location::current((location *)in_stack_ffffffffffffee18);
      if (cVar2 != ' ') {
        region::region(in_stack_ffffffffffffee90,in_stack_ffffffffffffee88);
        source_location::source_location(in_stack_ffffffffffffeea0,in_stack_ffffffffffffee98);
        region::~region((region *)in_stack_ffffffffffffee20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                   (allocator<char> *)in_stack_ffffffffffffee50);
        source_location::source_location
                  ((source_location *)in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                   (allocator<char> *)in_stack_ffffffffffffee50);
        make_error_info<>(in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe0,
                          in_stack_ffffffffffffefd8);
        err<toml::error_info>((error_info *)in_stack_ffffffffffffee78);
        result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                  (in_stack_ffffffffffffee20,(failure_type *)in_stack_ffffffffffffee18);
        failure<toml::error_info>::~failure((failure<toml::error_info> *)0x667b69);
        error_info::~error_info((error_info *)in_stack_ffffffffffffee20);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20);
        std::allocator<char>::~allocator(local_3b9);
        source_location::~source_location((source_location *)in_stack_ffffffffffffee20);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20);
        std::allocator<char>::~allocator(local_319);
        local_164 = 1;
        source_location::~source_location((source_location *)in_stack_ffffffffffffee20);
        goto LAB_00668ef6;
      }
      location::advance(in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
      local_78.delimiter = space;
    }
  }
  parse_local_time_only<toml::type_config>(in_stack_00000bd8,in_stack_00000bd0);
  bVar1 = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
          ::is_err(&local_450);
  if (bVar1) {
    local_4b0 = &PTR_s__workspace_llm4binary_github_lic_009330b8;
    result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
    ::unwrap_err(in_stack_ffffffffffffee78,in_stack_ffffffffffffee80);
    err<toml::error_info&>((error_info *)in_stack_ffffffffffffee78);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (in_stack_ffffffffffffee20,(failure_type *)in_stack_ffffffffffffee18);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x667d62);
    local_164 = 1;
  }
  else {
    local_4b8 = &PTR_s__workspace_llm4binary_github_lic_009330d0;
    result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
    ::unwrap(in_stack_ffffffffffffee78,in_stack_ffffffffffffee80);
    p_Var3 = std::get<1ul,toml::local_time,toml::local_time_format_info,toml::detail::region>
                       ((tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                         *)0x667dec);
    local_78.has_seconds = (bool)(p_Var3->has_seconds & 1);
    local_4c0 = &PTR_s__workspace_llm4binary_github_lic_009330e8;
    result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
    ::unwrap(in_stack_ffffffffffffee78,in_stack_ffffffffffffee80);
    p_Var3 = std::get<1ul,toml::local_time,toml::local_time_format_info,toml::detail::region>
                       ((tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                         *)0x667e32);
    local_78.subsecond_precision = p_Var3->subsecond_precision;
    syntax::time_offset((spec *)in_stack_ffffffffffffef48);
    either::scan(in_stack_ffffffffffffee58,(location *)in_stack_ffffffffffffee50);
    either::~either((either *)in_stack_ffffffffffffee20);
    bVar1 = region::is_ok((region *)0x667e8e);
    if (bVar1) {
      region::as_string_abi_cxx11_((region *)in_stack_ffffffffffffee78);
      time_offset::time_offset(local_6d2,0,0);
      pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
      if ((*pvVar4 == '+') ||
         (pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   at((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffffee30,in_stack_ffffffffffffee28), *pvVar4 == '-')) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee38,(size_type)in_stack_ffffffffffffee30,
                   in_stack_ffffffffffffee28);
        from_string<int>(in_stack_ffffffffffffefd8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee38,(size_type)in_stack_ffffffffffffee30,
                   in_stack_ffffffffffffee28);
        from_string<int>(in_stack_ffffffffffffefd8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20);
        bVar1 = result<int,_toml::detail::none_t>::is_err(&local_6dc);
        if (bVar1) {
          region::region(in_stack_ffffffffffffee90,in_stack_ffffffffffffee88);
          source_location::source_location(in_stack_ffffffffffffeea0,in_stack_ffffffffffffee98);
          region::~region((region *)in_stack_ffffffffffffee20);
          in_stack_ffffffffffffeea0 = &local_8d9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                     (allocator<char> *)in_stack_ffffffffffffee50);
          source_location::source_location
                    ((source_location *)in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
          in_stack_ffffffffffffee98 = &local_979;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                     (allocator<char> *)in_stack_ffffffffffffee50);
          make_error_info<>(in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe0,
                            in_stack_ffffffffffffefd8);
          in_stack_ffffffffffffee90 = local_860;
          err<toml::error_info>((error_info *)in_stack_ffffffffffffee78);
          result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                    (in_stack_ffffffffffffee20,(failure_type *)in_stack_ffffffffffffee18);
          failure<toml::error_info>::~failure((failure<toml::error_info> *)0x66835f);
          error_info::~error_info((error_info *)in_stack_ffffffffffffee20);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee20);
          std::allocator<char>::~allocator((allocator<char> *)&local_979);
          source_location::~source_location((source_location *)in_stack_ffffffffffffee20);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee20);
          std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
          local_164 = 1;
          source_location::~source_location((source_location *)in_stack_ffffffffffffee20);
        }
        else {
          bVar1 = result<int,_toml::detail::none_t>::is_err(local_708);
          if (bVar1) {
            region::region(in_stack_ffffffffffffee90,in_stack_ffffffffffffee88);
            source_location::source_location(in_stack_ffffffffffffeea0,in_stack_ffffffffffffee98);
            region::~region((region *)in_stack_ffffffffffffee20);
            in_stack_ffffffffffffee88 = &local_b31;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                       (allocator<char> *)in_stack_ffffffffffffee50);
            source_location::source_location
                      ((source_location *)in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
            in_stack_ffffffffffffee80._M_impl = local_bd1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                       (allocator<char> *)in_stack_ffffffffffffee50);
            make_error_info<>(in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe0,
                              in_stack_ffffffffffffefd8);
            in_stack_ffffffffffffee78 = local_ab8;
            err<toml::error_info>((error_info *)in_stack_ffffffffffffee78);
            result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                      (in_stack_ffffffffffffee20,(failure_type *)in_stack_ffffffffffffee18);
            failure<toml::error_info>::~failure((failure<toml::error_info> *)0x668688);
            error_info::~error_info((error_info *)in_stack_ffffffffffffee20);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffee20);
            std::allocator<char>::~allocator((allocator<char> *)local_bd1);
            source_location::~source_location((source_location *)in_stack_ffffffffffffee20);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffee20);
            std::allocator<char>::~allocator((allocator<char> *)&local_b31);
            local_164 = 1;
            source_location::~source_location((source_location *)in_stack_ffffffffffffee20);
          }
          else {
            local_be0 = &PTR_s__workspace_llm4binary_github_lic_00933100;
            in_stack_ffffffffffffee70 =
                 (basic_value<toml::type_config> *)
                 result<int,_toml::detail::none_t>::unwrap
                           ((result<int,_toml::detail::none_t> *)in_stack_ffffffffffffee78,
                            in_stack_ffffffffffffee80);
            local_bd8 = *(value_type *)in_stack_ffffffffffffee70;
            local_bf0 = &PTR_s__workspace_llm4binary_github_lic_00933118;
            in_stack_ffffffffffffee68 =
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)result<int,_toml::detail::none_t>::unwrap
                              ((result<int,_toml::detail::none_t> *)in_stack_ffffffffffffee78,
                               in_stack_ffffffffffffee80);
            local_be4 = *(int *)&(in_stack_ffffffffffffee68->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
            in_stack_ffffffffffffee60 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
            if (*(char *)&(in_stack_ffffffffffffee60->_M_dataplus)._M_p == '+') {
              time_offset::time_offset(&local_bf2,local_bd8,local_be4);
              local_6d2[0] = local_bf2;
            }
            else {
              time_offset::time_offset(&local_bf4,-local_bd8,-local_be4);
              local_6d2[0] = local_bf4;
            }
            local_164 = 0;
          }
        }
        result<int,_toml::detail::none_t>::~result((result<int,_toml::detail::none_t> *)0x6688ee);
        result<int,_toml::detail::none_t>::~result((result<int,_toml::detail::none_t> *)0x6688fb);
        if (local_164 == 0) goto LAB_0066892f;
      }
      else {
LAB_0066892f:
        if ((((local_6d2[0].hour < -0x18) || ('\x18' < local_6d2[0].hour)) ||
            (local_6d2[0].minute < -0x3c)) || ('<' < local_6d2[0].minute)) {
          __s = local_cc9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffee60,(char *)__s,
                     (allocator<char> *)in_stack_ffffffffffffee50);
          region::region(in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,
                         in_stack_ffffffffffffee40);
          source_location::source_location(in_stack_ffffffffffffeea0,in_stack_ffffffffffffee98);
          __a = local_dd1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffee60,(char *)__s,__a);
          make_error_info<>(in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe0,
                            in_stack_ffffffffffffefd8);
          err<toml::error_info>((error_info *)in_stack_ffffffffffffee78);
          result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                    (in_stack_ffffffffffffee20,(failure_type *)in_stack_ffffffffffffee18);
          failure<toml::error_info>::~failure((failure<toml::error_info> *)0x668a61);
          error_info::~error_info((error_info *)in_stack_ffffffffffffee20);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee20);
          std::allocator<char>::~allocator((allocator<char> *)local_dd1);
          source_location::~source_location((source_location *)in_stack_ffffffffffffee20);
          region::~region((region *)in_stack_ffffffffffffee20);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee20);
          std::allocator<char>::~allocator(local_cc9);
          local_164 = 1;
        }
        else {
          region::region(in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,
                         in_stack_ffffffffffffee40);
          result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
          ::unwrap((result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
                    *)in_stack_ffffffffffffee78,in_stack_ffffffffffffee80);
          p_Var5 = std::get<0ul,toml::local_date,toml::local_date_format_info,toml::detail::region>
                             ((tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>
                               *)0x668c18);
          d.year = p_Var5->year;
          d.month = p_Var5->month;
          d.day = p_Var5->day;
          result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
          ::unwrap(in_stack_ffffffffffffee78,in_stack_ffffffffffffee80);
          p_Var6 = std::get<0ul,toml::local_time,toml::local_time_format_info,toml::detail::region>
                             ((tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                               *)0x668c56);
          t.hour = p_Var6->hour;
          t.minute = p_Var6->minute;
          t.second = p_Var6->second;
          t._3_1_ = p_Var6->field_0x3;
          t.millisecond = p_Var6->millisecond;
          t.microsecond = p_Var6->microsecond;
          t.nanosecond = p_Var6->nanosecond;
          local_datetime::local_datetime(&local_e5e,d,t);
          offset_datetime::offset_datetime(local_e50,&local_e5e,local_6d2[0]);
          local_1048._0_2_ = local_e50[0].date.year;
          local_1048._2_1_ = local_e50[0].date.month;
          local_1048._3_1_ = local_e50[0].date.day;
          local_1048._4_1_ = local_e50[0].time.hour;
          local_1048._5_1_ = local_e50[0].time.minute;
          local_1048._6_1_ = local_e50[0].time.second;
          local_1048._7_1_ = local_e50[0].time._3_1_;
          sStack_1040._0_2_ = local_e50[0].time.millisecond;
          sStack_1040._2_2_ = local_e50[0].time.microsecond;
          sStack_1040._4_2_ = local_e50[0].time.nanosecond;
          sStack_1040._6_1_ = local_e50[0].offset.hour;
          sStack_1040._7_1_ = local_e50[0].offset.minute;
          local_1058 = CONCAT62(local_78._2_6_,CONCAT11(local_78.has_seconds,local_78.delimiter));
          sStack_1050 = local_78.subsecond_precision;
          local_1078._M_allocated_capacity = 0;
          local_1078._8_8_ = 0;
          local_1068 = 0;
          this = &local_1078;
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x668d2b);
          s = (success_type *)&stack0xffffffffffffef20;
          region::region((region *)in_stack_ffffffffffffee20,(region *)in_stack_ffffffffffffee18);
          x._8_8_ = in_stack_ffffffffffffee90;
          x._0_8_ = in_stack_ffffffffffffee88;
          fmt_00.subsecond_precision = (size_t)in_stack_ffffffffffffee80._M_impl;
          fmt_00._0_8_ = in_stack_ffffffffffffee78;
          basic_value<toml::type_config>::basic_value
                    (in_stack_ffffffffffffee70,x,fmt_00,in_stack_ffffffffffffee68,
                     (region_type *)in_stack_ffffffffffffeea0);
          ok<toml::basic_value<toml::type_config>>(in_stack_ffffffffffffef08);
          result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                    (in_stack_ffffffffffffee20,s);
          success<toml::basic_value<toml::type_config>_>::~success
                    ((success<toml::basic_value<toml::type_config>_> *)0x668dbf);
          basic_value<toml::type_config>::~basic_value
                    ((basic_value<toml::type_config> *)in_stack_ffffffffffffee20);
          region::~region((region *)in_stack_ffffffffffffee20);
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this);
          local_164 = 1;
          region::~region((region *)in_stack_ffffffffffffee20);
        }
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee20);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                 (allocator<char> *)in_stack_ffffffffffffee50);
      syntax::time_offset((spec *)in_stack_ffffffffffffef48);
      location::location(in_stack_ffffffffffffee40,in_stack_ffffffffffffee38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                 (allocator<char> *)in_stack_ffffffffffffee50);
      make_syntax_error<toml::detail::either>
                (in_stack_fffffffffffff088,in_stack_fffffffffffff080,in_stack_fffffffffffff078,
                 in_stack_fffffffffffff070);
      err<toml::error_info>((error_info *)in_stack_ffffffffffffee78);
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (in_stack_ffffffffffffee20,(failure_type *)in_stack_ffffffffffffee18);
      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x667f9a);
      error_info::~error_info((error_info *)in_stack_ffffffffffffee20);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee20);
      std::allocator<char>::~allocator(local_6a9);
      location::~location((location *)in_stack_ffffffffffffee20);
      either::~either((either *)in_stack_ffffffffffffee20);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee20);
      std::allocator<char>::~allocator(local_619);
      local_164 = 1;
    }
    region::~region((region *)in_stack_ffffffffffffee20);
  }
  result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
  ::~result((result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
             *)0x668ee5);
LAB_00668ef6:
  result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
  ::~result((result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
             *)0x668f03);
  location::~location((location *)in_stack_ffffffffffffee20);
  return in_RDI;
}

Assistant:

result<basic_value<TC>, error_info>
parse_offset_datetime(location& loc, const context<TC>& ctx)
{
    using char_type = location::char_type;

    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    offset_datetime_format_info fmt;

    // ----------------------------------------------------------------------
    // date part

    auto date_fmt_reg = parse_local_date_only(loc, ctx);
    if(date_fmt_reg.is_err())
    {
        return err(date_fmt_reg.unwrap_err());
    }

    // ----------------------------------------------------------------------
    // delimiter

    if(loc.current() == char_type('T'))
    {
        loc.advance();
        fmt.delimiter = datetime_delimiter_kind::upper_T;
    }
    else if(loc.current() == char_type('t'))
    {
        loc.advance();
        fmt.delimiter = datetime_delimiter_kind::lower_t;
    }
    else if(loc.current() == char_type(' '))
    {
        loc.advance();
        fmt.delimiter = datetime_delimiter_kind::space;
    }
    else
    {
        auto src = source_location(region(loc));
        return err(make_error_info("toml::parse_offset_datetime: "
            "expect date-time delimiter `T` or ` `(space).", std::move(src), "here"
        ));
    }

    // ----------------------------------------------------------------------
    // time part

    auto time_fmt_reg = parse_local_time_only(loc, ctx);
    if(time_fmt_reg.is_err())
    {
        return err(time_fmt_reg.unwrap_err());
    }

    fmt.has_seconds         = std::get<1>(time_fmt_reg.unwrap()).has_seconds;
    fmt.subsecond_precision = std::get<1>(time_fmt_reg.unwrap()).subsecond_precision;

    // ----------------------------------------------------------------------
    // offset part

    const auto ofs_reg = syntax::time_offset(spec).scan(loc);
    if( ! ofs_reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_offset_datetime: "
            "invalid offset: offset must be like: Z, +01:00, or -10:00.",
            syntax::time_offset(spec), loc));
    }

    const auto ofs_str = ofs_reg.as_string();

    time_offset offset(0, 0);

    assert(ofs_str.size() != 0);

    if(ofs_str.at(0) == char_type('+') || ofs_str.at(0) == char_type('-'))
    {
        const auto hour_r   = from_string<int>(ofs_str.substr(1, 2));
        const auto minute_r = from_string<int>(ofs_str.substr(4, 2));
        if(hour_r.is_err())
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_offset_datetime: "
                "Failed to read offset hour part", std::move(src), "here"));
        }
        if(minute_r.is_err())
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_offset_datetime: "
                "Failed to read offset minute part", std::move(src), "here"));
        }
        const auto hour   = hour_r.unwrap();
        const auto minute = minute_r.unwrap();

        if(ofs_str.at(0) == '+')
        {
            offset = time_offset(hour, minute);
        }
        else
        {
            offset = time_offset(-hour, -minute);
        }
    }
    else
    {
        assert(ofs_str.at(0) == char_type('Z') || ofs_str.at(0) == char_type('z'));
    }

    if (offset.hour   < -24 || 24 < offset.hour ||
        offset.minute < -60 || 60 < offset.minute)
    {
        return err(make_error_info("toml::parse_offset_datetime: "
            "too large offset: |hour| <= 24, |minute| <= 60",
            source_location(region(first, loc)), "here"));
    }


    // ----------------------------------------------------------------------

    region reg(first, loc);
    offset_datetime val(local_datetime(std::get<0>(date_fmt_reg.unwrap()),
                                       std::get<0>(time_fmt_reg.unwrap())),
                                       offset);

    return ok(basic_value<TC>(val, std::move(fmt), {}, std::move(reg)));
}